

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_compiler.c
# Opt level: O2

gravity_compiler_t * gravity_compiler_create(gravity_delegate_t *delegate)

{
  gravity_compiler_t *pgVar1;
  void_r *pvVar2;
  
  pgVar1 = (gravity_compiler_t *)gravity_calloc((gravity_vm *)0x0,1,0x30);
  if (pgVar1 != (gravity_compiler_t *)0x0) {
    pgVar1->ast = (gnode_t *)0x0;
    pvVar2 = void_array_create();
    pgVar1->objects = pvVar2;
    pgVar1->delegate = delegate;
  }
  return pgVar1;
}

Assistant:

gravity_compiler_t *gravity_compiler_create (gravity_delegate_t *delegate) {
    gravity_compiler_t *compiler = mem_alloc(NULL, sizeof(gravity_compiler_t));
    if (!compiler) return NULL;

    compiler->ast = NULL;
    compiler->objects = void_array_create();
    compiler->delegate = delegate;
    return compiler;
}